

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_xml.cc
# Opt level: O1

void __thiscall iqxmlrpc::Value_type_to_xml::do_visit_int64(Value_type_to_xml *this,int64_t val)

{
  char *tmp_finish;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  string local_98;
  Node local_78 [5];
  char local_4f [7];
  char *local_48;
  char *local_40;
  lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char> local_38;
  
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_48 = (char *)((long)&local_78[0].ctx + 2);
  local_38.m_value = -val;
  if (0 < val) {
    local_38.m_value = val;
  }
  local_38.m_czero = '0';
  local_38.m_zero = 0x30;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_40 = local_4f;
  local_38.m_finish = local_4f;
  local_48 = boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_long,_char>::convert
                       (&local_38);
  if (val < 0) {
    local_48[-1] = '-';
    local_48 = local_48 + -1;
  }
  local_40 = local_4f;
  std::__cxx11::string::replace
            ((ulong)&local_98,0,(char *)local_98._M_string_length,(ulong)local_48);
  XmlBuilder::Node::Node(local_78,this->builder_,"i8");
  XmlBuilder::Node::set_textdata(local_78,&local_98);
  XmlBuilder::Node::~Node(local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,
                    CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                             local_98.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Value_type_to_xml::do_visit_int64(int64_t val)
{
  add_textnode("i8", boost::lexical_cast<std::string>(val));
}